

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void SQCompilation::StaticAnalyzer::reportGlobalNamesWarnings(HSQUIRRELVM vm)

{
  _Rb_tree_node_base *__k;
  undefined8 uVar1;
  _Rb_tree_node_base *p_Var2;
  iterator iVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  int32_t i;
  ulong uVar7;
  _Base_ptr p_Var8;
  long lVar9;
  string message;
  string local_60;
  SQCOMPILERERROR local_40;
  HSQUIRRELVM local_38;
  
  local_40 = vm->_sharedstate->_compilererrorhandler;
  if (local_40 != (SQCOMPILERERROR)0x0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    p_Var2 = (_Rb_tree_node_base *)declaredGlobals_abi_cxx11_._24_8_;
    local_38 = vm;
    if (declaredGlobals_abi_cxx11_._24_8_ != 0x1a91d0) {
      do {
        p_Var8 = *(_Base_ptr *)(p_Var2 + 2);
        p_Var5 = p_Var2[2]._M_parent;
        if ((long)p_Var5 - (long)p_Var8 != 0x18 && p_Var5 != p_Var8) {
          uVar1 = *(undefined8 *)(p_Var2 + 1);
          lVar9 = 0x10;
          uVar7 = 0;
          do {
            if (*(char *)((long)&p_Var8->_M_color + lVar9) == '\0') {
              local_60._M_string_length = 0;
              *local_60._M_dataplus._M_p = '\0';
              SQCompilationContext::renderDiagnosticHeader(DI_GLOBAL_NAME_REDEF,&local_60,uVar1);
              (*local_40)(local_38,SEV_WARNING,local_60._M_dataplus._M_p,
                          *(SQChar **)((long)p_Var8 + lVar9 + -0x10),
                          (long)*(int *)((long)p_Var8 + lVar9 + -8),
                          (long)*(int *)((long)p_Var8 + lVar9 + -4),"\n");
              p_Var8 = *(_Base_ptr *)(p_Var2 + 2);
              p_Var5 = p_Var2[2]._M_parent;
            }
            uVar7 = uVar7 + 1;
            uVar6 = ((long)p_Var5 - (long)p_Var8 >> 3) * -0x5555555555555555;
            lVar9 = lVar9 + 0x18;
          } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
        }
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      } while (p_Var2 != (_Rb_tree_node_base *)(declaredGlobals_abi_cxx11_ + 8));
    }
    p_Var2 = (_Rb_tree_node_base *)usedGlobals_abi_cxx11_._24_8_;
    if (usedGlobals_abi_cxx11_._24_8_ != 0x1a9200) {
      do {
        __k = p_Var2 + 1;
        iVar3 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)knownBindings_abi_cxx11_,(key_type *)__k);
        if ((iVar3.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur == (__node_type *)0x0) &&
           (iVar4 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                            *)declaredGlobals_abi_cxx11_,(key_type *)__k),
           iVar4._M_node == (_Base_ptr)(declaredGlobals_abi_cxx11_ + 8))) {
          p_Var8 = *(_Base_ptr *)(p_Var2 + 2);
          p_Var5 = p_Var2[2]._M_parent;
          if (p_Var5 != p_Var8) {
            lVar9 = 0x10;
            uVar7 = 0;
            do {
              if (*(char *)((long)&p_Var8->_M_color + lVar9) == '\0') {
                local_60._M_string_length = 0;
                *local_60._M_dataplus._M_p = '\0';
                SQCompilationContext::renderDiagnosticHeader
                          (DI_UNDEFINED_GLOBAL,&local_60,*(undefined8 *)__k);
                (*local_40)(local_38,SEV_WARNING,local_60._M_dataplus._M_p,
                            *(SQChar **)((long)p_Var8 + lVar9 + -0x10),
                            (long)*(int *)((long)p_Var8 + lVar9 + -8),
                            (long)*(int *)((long)p_Var8 + lVar9 + -4),"\n");
                p_Var8 = *(_Base_ptr *)(p_Var2 + 2);
                p_Var5 = p_Var2[2]._M_parent;
              }
              uVar7 = uVar7 + 1;
              uVar6 = ((long)p_Var5 - (long)p_Var8 >> 3) * -0x5555555555555555;
              lVar9 = lVar9 + 0x18;
            } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
          }
        }
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      } while (p_Var2 != (_Rb_tree_node_base *)(usedGlobals_abi_cxx11_ + 8));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void StaticAnalyzer::reportGlobalNamesWarnings(HSQUIRRELVM vm) {
  auto errorFunc = _ss(vm)->_compilererrorhandler;

  if (!errorFunc)
    return;

  // 1. Check multiple declarations

  std::string message;

  for (auto it = declaredGlobals.begin(); it != declaredGlobals.end(); ++it) {
    const SQChar *name = it->first.c_str();
    const auto &declarations = it->second;

    if (declarations.size() == 1)
      continue;

    for (int32_t i = 0; i < declarations.size(); ++i) {
      const IdLocation &loc = declarations[i];
      if (loc.diagSilenced)
        continue;

      message.clear();
      SQCompilationContext::renderDiagnosticHeader(DiagnosticsId::DI_GLOBAL_NAME_REDEF, &message, name);
      errorFunc(vm, SEV_WARNING, message.c_str(), loc.filename, loc.line, loc.column, "\n");
    }
  }

  // 2. Check undefined usages

  for (auto it = usedGlobals.begin(); it != usedGlobals.end(); ++it) {
    const std::string &id = it->first;

    bool isKnownBinding = knownBindings.find(id) != knownBindings.end();
    if (isKnownBinding)
      continue;

    if (declaredGlobals.find(id) != declaredGlobals.end())
      continue;

    const auto &usages = it->second;

    for (int32_t i = 0; i < usages.size(); ++i) {
      const IdLocation &loc = usages[i];
      if (loc.diagSilenced)
        continue;

      message.clear();
      SQCompilationContext::renderDiagnosticHeader(DiagnosticsId::DI_UNDEFINED_GLOBAL, &message, id.c_str());
      errorFunc(vm, SEV_WARNING, message.c_str(), loc.filename, loc.line, loc.column, "\n");
    }
  }
}